

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>(RepeatedPtrFieldBase *this)

{
  void **ppvVar1;
  uint uVar2;
  Rep *pRVar3;
  LogMessage *other;
  ulong uVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  uVar2 = this->current_size_;
  if ((int)uVar2 < 0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x60a);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (n) >= (0): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  else if ((ulong)uVar2 != 0) {
    pRVar3 = this->rep_;
    uVar4 = 0;
    do {
      ppvVar1 = pRVar3->elements + uVar4;
      uVar4 = uVar4 + 1;
      caffe::BlobProto::Clear((BlobProto *)*ppvVar1);
    } while (uVar2 != uVar4);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}